

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void sarimatest(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  sarima_object obj;
  ulong uVar2;
  int N;
  long lVar3;
  double dVar4;
  undefined1 local_25b8 [8];
  double temp [1200];
  
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/seriesG.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    N = 0;
    if (iVar1 == 0) {
      uVar2 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf \n",local_25b8 + uVar2);
        iVar1 = feof(__stream);
        uVar2 = uVar2 + 8;
        N = N + 1;
      } while (iVar1 == 0);
      temp[0x4af] = (double)malloc(uVar2 & 0x7fffffff8);
      memcpy((void *)temp[0x4af],local_25b8,uVar2 & 0x7fffffff8);
    }
    else {
      temp[0x4af] = (double)malloc(0);
    }
    lVar3 = 0;
    obj = sarima_init(0,1,1,0xc,0,1,1,N);
    sarima_setMethod(obj,1);
    sarima_setCSSML(obj,0);
    dVar4 = temp[0x4af];
    sarima_exec(obj,(double *)temp[0x4af]);
    sarima_summary(obj);
    sarima_predict(obj,(double *)dVar4,5,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",xpred[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    putchar(10);
    lVar3 = 0;
    printf("Standard Errors  : ");
    do {
      dVar4 = amse[lVar3];
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      printf("%g ",dVar4);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    putchar(10);
    sarima_free(obj);
    free((void *)temp[0x4af]);
    free(xpred);
    free(amse);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void sarimatest() {
	int i, N, d, L;
	double *inp;
	int p, q;
	int s, P, D, Q;
	double *phi, *theta;
	double *PHI, *THETA;
	double *xpred, *amse;
	sarima_object obj;
	p = 0;
	d = 1;
	q = 1;
	s = 12;
	P = 0;
	D = 1;
	Q = 1;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);
	PHI = (double*)malloc(sizeof(double)* P);
	THETA = (double*)malloc(sizeof(double)* Q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	//ifp = fopen("../data/itdaily.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}


	obj = sarima_init(p, d, q,s,P,D,Q, N);
	sarima_setMethod(obj, 1); // Method 0 ("MLE") is default so this step is unnecessary. The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	sarima_setCSSML(obj,0); // 0 - Only MLE , 1 - CSS + MLE
	//sarima_setOptMethod(obj, 7);// Method 5 ("BFGS") is default . The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	sarima_exec(obj, inp);
	sarima_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	sarima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	sarima_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(PHI);
	free(THETA);
	free(xpred);
	free(amse);
}